

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVm.cpp
# Opt level: O3

char * GetInstructionName(RegVmInstructionCode code)

{
  if (code < (rviTypeid|rviLoadByte)) {
    return &DAT_0020e8f8 + *(int *)(&DAT_0020e8f8 + (ulong)code * 4);
  }
  __assert_fail("!\"unknown instruction\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVm.cpp"
                ,0xcc,"const char *GetInstructionName(RegVmInstructionCode)");
}

Assistant:

const char* GetInstructionName(RegVmInstructionCode code)
{
	switch(code)
	{
	case rviNop:
		return "nop";
	case rviLoadByte:
		return "loadb";
	case rviLoadWord:
		return "loadw";
	case rviLoadDword:
		return "load";
	case rviLoadLong:
		return "loadq";
	case rviLoadFloat:
		return "loadf";
	case rviLoadDouble:
		return "loadd";
	case rviLoadImm:
		return "loadimm";
	case rviStoreByte:
		return "storeb";
	case rviStoreWord:
		return "storew";
	case rviStoreDword:
		return "store";
	case rviStoreLong:
		return "storeq";
	case rviStoreFloat:
		return "storef";
	case rviStoreDouble:
		return "stored";
	case rviCombinedd:
		return "combdd";
	case rviBreakupdd:
		return "breakdd";
	case rviMov:
		return "mov";
	case rviMovMult:
		return "movmult";
	case rviDtoi:
		return "dtoi";
	case rviDtol:
		return "dtol";
	case rviDtof:
		return "dtof";
	case rviItod:
		return "itod";
	case rviLtod:
		return "ltod";
	case rviItol:
		return "itol";
	case rviLtoi:
		return "ltoi";
	case rviIndex:
		return "index";
	case rviGetAddr:
		return "getaddr";
	case rviSetRange:
		return "setrange";
	case rviMemCopy:
		return "memcopy";
	case rviJmp:
		return "jmp";
	case rviJmpz:
		return "jmpz";
	case rviJmpnz:
		return "jmpnz";
	case rviCall:
		return "call";
	case rviCallPtr:
		return "callp";
	case rviReturn:
		return "ret";
	case rviAddImm:
		return "addimm";
	case rviAdd:
		return "add";
	case rviSub:
		return "sub";
	case rviMul:
		return "mul";
	case rviDiv:
		return "div";
	case rviPow:
		return "pow";
	case rviMod:
		return "mod";
	case rviLess:
		return "less";
	case rviGreater:
		return "greater";
	case rviLequal:
		return "lequal";
	case rviGequal:
		return "gequal";
	case rviEqual:
		return "equal";
	case rviNequal:
		return "nequal";
	case rviShl:
		return "shl";
	case rviShr:
		return "shr";
	case rviBitAnd:
		return "bitand";
	case rviBitOr:
		return "bitor";
	case rviBitXor:
		return "bitxor";
	case rviAddImml:
		return "addimml";
	case rviAddl:
		return "addl";
	case rviSubl:
		return "subl";
	case rviMull:
		return "mull";
	case rviDivl:
		return "divl";
	case rviPowl:
		return "powl";
	case rviModl:
		return "modl";
	case rviLessl:
		return "lessl";
	case rviGreaterl:
		return "greaterl";
	case rviLequall:
		return "lequall";
	case rviGequall:
		return "gequall";
	case rviEquall:
		return "equall";
	case rviNequall:
		return "nequall";
	case rviShll:
		return "shll";
	case rviShrl:
		return "shrl";
	case rviBitAndl:
		return "bitandl";
	case rviBitOrl:
		return "bitorl";
	case rviBitXorl:
		return "bitxorl";
	case rviAddd:
		return "addd";
	case rviSubd:
		return "subd";
	case rviMuld:
		return "muld";
	case rviDivd:
		return "divd";
	case rviAddf:
		return "addf";
	case rviSubf:
		return "subf";
	case rviMulf:
		return "mulf";
	case rviDivf:
		return "divf";
	case rviPowd:
		return "powd";
	case rviModd:
		return "modd";
	case rviLessd:
		return "lessd";
	case rviGreaterd:
		return "greaterd";
	case rviLequald:
		return "lequald";
	case rviGequald:
		return "gequald";
	case rviEquald:
		return "equald";
	case rviNequald:
		return "nequald";
	case rviNeg:
		return "neg";
	case rviNegl:
		return "negl";
	case rviNegd:
		return "negd";
	case rviBitNot:
		return "bitnot";
	case rviBitNotl:
		return "bitnotl";
	case rviLogNot:
		return "lognot";
	case rviLogNotl:
		return "lognotl";
	case rviConvertPtr:
		return "convertptr";
	case rviFuncAddr:
		return "funcaddr";
	case rviTypeid:
		return "typeid";
	default:
		assert(!"unknown instruction");
	}

	return "";
}